

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int pagerUnlockDb(Pager *pPager,int eLock)

{
  uint uVar1;
  sqlite3_io_methods *psVar2;
  
  psVar2 = pPager->fd->pMethods;
  if (psVar2 != (sqlite3_io_methods *)0x0) {
    if (pPager->noLock == '\0') {
      uVar1 = (*psVar2->xUnlock)(pPager->fd,eLock);
      psVar2 = (sqlite3_io_methods *)(ulong)uVar1;
    }
    if (pPager->eLock != '\x05') {
      pPager->eLock = (u8)eLock;
    }
  }
  pPager->changeCountDone = pPager->tempFile;
  return (int)CONCAT71((int7)((ulong)psVar2 >> 8),pPager->tempFile);
}

Assistant:

static int pagerUnlockDb(Pager *pPager, int eLock){
  int rc = SQLITE_OK;

  assert( !pPager->exclusiveMode || pPager->eLock==eLock );
  assert( eLock==NO_LOCK || eLock==SHARED_LOCK );
  assert( eLock!=NO_LOCK || pagerUseWal(pPager)==0 );
  if( isOpen(pPager->fd) ){
    assert( pPager->eLock>=eLock );
    rc = pPager->noLock ? SQLITE_OK : sqlite3OsUnlock(pPager->fd, eLock);
    if( pPager->eLock!=UNKNOWN_LOCK ){
      pPager->eLock = (u8)eLock;
    }
    IOTRACE(("UNLOCK %p %d\n", pPager, eLock))
  }
  pPager->changeCountDone = pPager->tempFile; /* ticket fb3b3024ea238d5c */
  return rc;
}